

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O2

size_t warhawk::common::string_write_cb(void *contents_,size_t size_,size_t nmemb_,void *userp_)

{
  size_t sVar1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  sVar1 = size_ * nmemb_;
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,contents_,(void *)((long)contents_ + sVar1));
    std::__cxx11::string::append((string *)userp_);
    std::__cxx11::string::~string((string *)local_30);
  }
  return sVar1;
}

Assistant:

static size_t string_write_cb( void *contents_, size_t size_, size_t nmemb_, void *userp_ )
{
  size_t realsize = size_ * nmemb_;

  if ( realsize == 0 )
  {
    return 0;
  }

  std::string* str = static_cast< std::string * >( userp_ );

  try
  {
    str->append( std::string( (const char *) contents_, realsize ) );
  }
  catch ( ... )
  {
    return 0;
  }

  return realsize;
}